

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

void xmlXPathSubstringAfterFunction(xmlXPathParserContextPtr ctxt,int nargs)

{
  uint uVar1;
  int iVar2;
  xmlXPathObjectPtr pxVar3;
  xmlXPathObjectPtr pxVar4;
  xmlChar *pxVar5;
  xmlXPathObjectPtr value;
  xmlXPathObjectPtr *ppxVar6;
  uint uVar7;
  ulong uVar8;
  
  if (ctxt == (xmlXPathParserContextPtr)0x0) {
    return;
  }
  if (nargs != 2) {
    iVar2 = 0xc;
LAB_001c366b:
    xmlXPathErr(ctxt,iVar2);
    return;
  }
  uVar7 = ctxt->valueNr;
  if ((int)uVar7 < 2) {
    iVar2 = 0x17;
    goto LAB_001c366b;
  }
  if ((ctxt->value == (xmlXPathObjectPtr)0x0) || (ctxt->value->type == XPATH_STRING)) {
    uVar1 = uVar7 - 1;
    ctxt->valueNr = uVar1;
    ppxVar6 = ctxt->valueTab;
LAB_001c3693:
    uVar8 = (ulong)uVar1;
    pxVar4 = ppxVar6[(ulong)uVar7 - 2];
  }
  else {
    xmlXPathStringFunction(ctxt,1);
    uVar7 = ctxt->valueNr;
    uVar8 = 0;
    if ((int)uVar7 < 1) {
      pxVar4 = (xmlXPathObjectPtr)0x0;
      goto LAB_001c36b0;
    }
    uVar1 = uVar7 - 1;
    ctxt->valueNr = uVar1;
    ppxVar6 = ctxt->valueTab;
    if (uVar7 != 1) goto LAB_001c3693;
    pxVar4 = (xmlXPathObjectPtr)0x0;
  }
  ctxt->value = pxVar4;
  uVar7 = (uint)uVar8;
  pxVar4 = ppxVar6[uVar8];
  ppxVar6[uVar8] = (xmlXPathObjectPtr)0x0;
LAB_001c36b0:
  if ((ctxt->value != (xmlXPathObjectPtr)0x0) && (ctxt->value->type != XPATH_STRING)) {
    xmlXPathStringFunction(ctxt,1);
    uVar7 = ctxt->valueNr;
  }
  if ((int)uVar7 < 1) {
    pxVar3 = (xmlXPathObjectPtr)0x0;
  }
  else {
    uVar1 = uVar7 - 1;
    ctxt->valueNr = uVar1;
    ppxVar6 = ctxt->valueTab;
    if (uVar7 == 1) {
      pxVar3 = (xmlXPathObjectPtr)0x0;
    }
    else {
      pxVar3 = ppxVar6[(ulong)uVar7 - 2];
    }
    ctxt->value = pxVar3;
    pxVar3 = ppxVar6[uVar1];
    ppxVar6[uVar1] = (xmlXPathObjectPtr)0x0;
  }
  if (ctxt->error == 0) {
    pxVar5 = xmlStrstr(pxVar3->stringval,pxVar4->stringval);
    if (pxVar5 == (xmlChar *)0x0) {
      pxVar5 = "";
    }
    else {
      iVar2 = xmlStrlen(pxVar4->stringval);
      pxVar5 = pxVar5 + iVar2;
    }
    pxVar5 = xmlStrdup(pxVar5);
    if (pxVar5 == (xmlChar *)0x0) {
      xmlXPathPErrMemory(ctxt);
    }
    else {
      value = xmlXPathCacheWrapString(ctxt,pxVar5);
      valuePush(ctxt,value);
    }
  }
  xmlXPathReleaseObject(ctxt->context,pxVar3);
  xmlXPathReleaseObject(ctxt->context,pxVar4);
  return;
}

Assistant:

void
xmlXPathSubstringAfterFunction(xmlXPathParserContextPtr ctxt, int nargs) {
    xmlXPathObjectPtr str = NULL;
    xmlXPathObjectPtr find = NULL;
    const xmlChar *point;
    xmlChar *result;

    CHECK_ARITY(2);
    CAST_TO_STRING;
    find = valuePop(ctxt);
    CAST_TO_STRING;
    str = valuePop(ctxt);
    if (ctxt->error != 0)
        goto error;

    point = xmlStrstr(str->stringval, find->stringval);
    if (point == NULL) {
        result = xmlStrdup(BAD_CAST "");
    } else {
        result = xmlStrdup(point + xmlStrlen(find->stringval));
    }
    if (result == NULL) {
        xmlXPathPErrMemory(ctxt);
        goto error;
    }
    valuePush(ctxt, xmlXPathCacheWrapString(ctxt, result));

error:
    xmlXPathReleaseObject(ctxt->context, str);
    xmlXPathReleaseObject(ctxt->context, find);
}